

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aircraft.cpp
# Opt level: O3

void __thiscall XPMP2::Aircraft::SetRender(Aircraft *this,bool _bRender)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  pthread_t pVar4;
  bool bVar5;
  
  if ((this->bRender == _bRender) || (this->bRender = _bRender, _bRender)) {
    return;
  }
  pVar4 = pthread_self();
  bVar5 = true;
  if (pVar4 == DAT_002ec7b0) {
    (*this->_vptr_Aircraft[0xe])(this);
    ContrailRemove(this);
    if ((this->listInst).super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
        super__List_node_base._M_next != (_List_node_base *)&this->listInst) {
      do {
        p_Var2 = (this->listInst).super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
                 super__List_node_base._M_prev;
        p_Var3 = p_Var2[1]._M_next;
        psVar1 = &(this->listInst).super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node
                  ._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var2,0x18);
        XPLMDestroyInstance(p_Var3);
      } while ((this->listInst).super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
               super__List_node_base._M_next != (_List_node_base *)&this->listInst);
      if (glob < 1) {
        bVar5 = false;
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Aircraft.cpp"
               ,0x2d2,"DestroyInstances",logDEBUG,"Aircraft 0x%06X: Instance destroyed",
               (ulong)this->modeS_id);
        goto LAB_0022058c;
      }
    }
    bVar5 = false;
  }
LAB_0022058c:
  this->bDestroyInst = bVar5;
  return;
}

Assistant:

void Aircraft::SetRender (bool _bRender)
{
    // no change?
    if (bRender == _bRender)
        return;
    
    // Set the flag
    bRender = _bRender;
    
    // In case rendering is _now_ switched off: Remove the instance (but leave AI as is!)
    if (!bRender)
        DestroyInstances();
}